

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

LINK_ENDPOINT_INSTANCE * find_link_endpoint_by_name(SESSION_INSTANCE *session,char *name)

{
  int iVar1;
  LINK_ENDPOINT_INSTANCE *local_28;
  LINK_ENDPOINT_INSTANCE *result;
  uint32_t i;
  char *name_local;
  SESSION_INSTANCE *session_local;
  
  result._4_4_ = 0;
  while ((result._4_4_ < session->link_endpoint_count &&
         (iVar1 = strcmp(session->link_endpoints[result._4_4_]->name,name), iVar1 != 0))) {
    result._4_4_ = result._4_4_ + 1;
  }
  if (result._4_4_ == session->link_endpoint_count) {
    local_28 = (LINK_ENDPOINT_INSTANCE *)0x0;
  }
  else {
    local_28 = session->link_endpoints[result._4_4_];
  }
  return local_28;
}

Assistant:

static LINK_ENDPOINT_INSTANCE* find_link_endpoint_by_name(SESSION_INSTANCE* session, const char* name)
{
    uint32_t i;
    LINK_ENDPOINT_INSTANCE* result;

    for (i = 0; i < session->link_endpoint_count; i++)
    {
        if (strcmp(session->link_endpoints[i]->name, name) == 0)
        {
            break;
        }
    }

    if (i == session->link_endpoint_count)
    {
        result = NULL;
    }
    else
    {
        result = session->link_endpoints[i];
    }

    return result;
}